

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_replaceAString_failure_nullptr_fn(int _i)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  AString rep;
  AString old;
  
  private_ACUtilsTest_AString_constructTestString(&old,"xy",2);
  private_ACUtilsTest_AString_constructTestString(&rep,"abc",3);
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  bVar1 = AString_replaceAString((AString *)0x0,&old,&rep,0);
  if (bVar1 != false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x863,
                      "Assertion \'!AString_replaceAString(((void*)0), &old, &rep, 0)\' failed",0,0)
    ;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x863);
  if (old.capacity == 2) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x864);
    if (old.buffer == (char *)0x0) {
      rep.size = 0;
      pcVar7 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (old).buffer != NULL";
      pcVar6 = "(void*) (old).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x864);
      if (old.buffer == (char *)0x0) {
        rep.size = 0x16819b;
        old.buffer = "(null)";
      }
      else {
        uVar3 = (byte)*old.buffer - 0x78;
        if ((uVar3 == 0) && (uVar3 = (byte)old.buffer[1] - 0x79, uVar3 == 0)) {
          uVar3 = (uint)(byte)old.buffer[2];
        }
        if (uVar3 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x864);
          if (old.size != 2) {
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(old).size == strlen(\"xy\")";
            pcVar6 = "(old).size";
            rep.size = old.size;
            pcVar7 = "strlen(\"xy\")";
            goto LAB_001450fe;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x864);
          if (rep.capacity == 3) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x865);
            if (rep.buffer == (char *)0x0) {
              rep.size = 0;
              pcVar7 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (rep).buffer != NULL";
              pcVar6 = "(void*) (rep).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x865);
              pcVar7 = rep.buffer;
              if (rep.buffer == (char *)0x0) {
                pcVar7 = "(null)";
                rep.size = 0x16819b;
              }
              else {
                iVar2 = strcmp("abc",rep.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x865);
                  if (rep.size == 3) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x865);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x866);
                      (*old.deallocator)(old.buffer);
                      (*rep.deallocator)(rep.buffer);
                      return;
                    }
                    pcVar7 = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x866;
                    rep.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_00145237;
                  }
                  pcVar7 = "strlen(\"abc\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = "(rep).size == strlen(\"abc\")";
                  pcVar6 = "(rep).size";
                  goto LAB_00145232;
                }
                rep.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(rep).buffer == (\"abc\")";
              pcVar6 = "(rep).buffer";
            }
          }
          else {
            pcVar7 = "(3)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(rep).capacity == (3)";
            pcVar6 = "(rep).capacity";
            rep.size = rep.capacity;
          }
LAB_00145232:
          iVar2 = 0x865;
          goto LAB_00145237;
        }
        rep.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(old).buffer == (\"xy\")";
      pcVar6 = "(old).buffer";
      pcVar7 = old.buffer;
    }
  }
  else {
    pcVar7 = "(2)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(old).capacity == (2)";
    pcVar6 = "(old).capacity";
    rep.size = old.capacity;
  }
LAB_001450fe:
  iVar2 = 0x864;
LAB_00145237:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,rep.size,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceAString_failure_nullptr)
{
    struct AString old = private_ACUtilsTest_AString_constructTestString("xy", 2);
    struct AString rep = private_ACUtilsTest_AString_constructTestString("abc", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    private_ACUtilsTest_AString_reallocCount = 0;
    ACUTILSTEST_ASSERT(!AString_replaceAString(nullptr, &old, &rep, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(old, "xy", 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(rep, "abc", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(old);
    private_ACUtilsTest_AString_destructTestString(rep);
}